

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::AddSchnorrSign
          (TransactionContext *this,OutPoint *outpoint,SchnorrSignature *signature,ByteData *annex)

{
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  *this_00;
  long in_RCX;
  long in_RDI;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  OutPoint *in_stack_fffffffffffffe88;
  TransactionContext *in_stack_fffffffffffffe90;
  ByteData *in_stack_fffffffffffffe98;
  SignParameter *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffea8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_fffffffffffffeb0;
  initializer_list<cfd::SignParameter> in_stack_fffffffffffffeb8;
  undefined1 **local_128;
  undefined1 local_e0 [24];
  undefined8 *local_c8;
  undefined1 *local_c0 [15];
  undefined8 *local_48;
  undefined8 local_40;
  long local_20;
  
  local_c8 = local_c0;
  local_20 = in_RCX;
  cfd::core::SchnorrSignature::GetData(SUB81(local_e0,0));
  SignParameter::SignParameter(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_48 = local_c0;
  local_40 = 1;
  std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x3b1455);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffea8);
  std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x3b1486);
  local_128 = (undefined1 **)&local_48;
  do {
    local_128 = local_128 + -0xf;
    SignParameter::~SignParameter
              ((SignParameter *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  } while (local_128 != local_c0);
  core::ByteData::~ByteData((ByteData *)0x3b14d0);
  if (local_20 != 0) {
    std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
    emplace_back<cfd::core::ByteData_const&>
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffffe90,(ByteData *)in_stack_fffffffffffffe88);
  }
  AddSign(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
          CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
          (bool)in_stack_fffffffffffffe7f,(bool)in_stack_fffffffffffffe7e);
  this_00 = (map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
             *)(in_RDI + 0x58);
  cfd::core::SchnorrSignature::GetSigHashType();
  std::
  map<cfd::core::OutPoint,cfd::core::SigHashType,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>>
  ::emplace<cfd::core::OutPoint_const&,cfd::core::SigHashType>
            (this_00,in_stack_fffffffffffffe88,
             (SigHashType *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_00);
  return;
}

Assistant:

void TransactionContext::AddSchnorrSign(
    const OutPoint& outpoint, const SchnorrSignature& signature,
    const ByteData* annex) {
  std::vector<SignParameter> sign_params = {
      SignParameter(signature.GetData(true))};
  if (annex != nullptr) sign_params.emplace_back(*annex);
  AddSign(outpoint, sign_params, true, true);
  signed_map_.emplace(outpoint, signature.GetSigHashType());
}